

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int linear_expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  bool bVar1;
  double dVar2;
  double local_98;
  double g0;
  double fnow;
  double enow;
  uint local_78;
  int hindex;
  int findex;
  int eindex;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double R;
  double Qnew;
  double q;
  double Q;
  double *h_local;
  double *f_local;
  int flen_local;
  double *e_local;
  int elen_local;
  
  fnow = *e;
  dVar2 = *f;
  bVar1 = fnow < dVar2 != -fnow < dVar2;
  if (bVar1) {
    g0 = f[1];
    local_98 = dVar2;
  }
  else {
    local_98 = fnow;
    g0 = dVar2;
    fnow = e[1];
  }
  hindex = (int)!bVar1;
  local_78 = (uint)bVar1;
  if ((hindex < elen) && ((flen <= (int)local_78 || (fnow < g0 == -fnow < g0)))) {
    R = fnow + local_98;
    dVar2 = R - fnow;
    hindex = hindex + 1;
    fnow = e[hindex];
  }
  else {
    R = g0 + local_98;
    dVar2 = R - g0;
    local_78 = local_78 + 1;
    g0 = f[(int)local_78];
  }
  Qnew = local_98 - dVar2;
  q = R;
  for (enow._4_4_ = 0; enow._4_4_ < elen + flen + -2; enow._4_4_ = enow._4_4_ + 1) {
    if ((hindex < elen) && ((flen <= (int)local_78 || (fnow < g0 == -fnow < g0)))) {
      bvirt = fnow + Qnew;
      h[enow._4_4_] = Qnew - (bvirt - fnow);
      hindex = hindex + 1;
      fnow = e[hindex];
    }
    else {
      bvirt = g0 + Qnew;
      h[enow._4_4_] = Qnew - (bvirt - g0);
      local_78 = local_78 + 1;
      g0 = f[(int)local_78];
    }
    dVar2 = q + bvirt;
    Qnew = (q - (dVar2 - (dVar2 - q))) + (bvirt - (dVar2 - q));
    q = dVar2;
  }
  h[enow._4_4_] = Qnew;
  h[enow._4_4_ + 1] = q;
  return enow._4_4_ + 2;
}

Assistant:

int linear_expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q, q;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (hindex = 0; hindex < elen + flen - 2; hindex++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, h[hindex]);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, h[hindex]);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
  }
  h[hindex] = q;
  h[hindex + 1] = Q;
  return hindex + 2;
}